

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O0

shared_ptr<celero::Experiment> __thiscall celero::Benchmark::getExperiment(Benchmark *this,size_t x)

{
  Impl *pIVar1;
  size_type sVar2;
  reference pvVar3;
  ulong in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<celero::Experiment> sVar5;
  size_t x_local;
  Benchmark *this_local;
  
  pIVar1 = Pimpl<celero::Benchmark::Impl>::operator->((Pimpl<celero::Benchmark::Impl> *)x);
  sVar2 = std::
          vector<std::shared_ptr<celero::Experiment>,_std::allocator<std::shared_ptr<celero::Experiment>_>_>
          ::size(&pIVar1->experiments);
  if (in_RDX < sVar2) {
    pIVar1 = Pimpl<celero::Benchmark::Impl>::operator->((Pimpl<celero::Benchmark::Impl> *)x);
    pvVar3 = std::
             vector<std::shared_ptr<celero::Experiment>,_std::allocator<std::shared_ptr<celero::Experiment>_>_>
             ::operator[](&pIVar1->experiments,in_RDX);
    std::shared_ptr<celero::Experiment>::shared_ptr((shared_ptr<celero::Experiment> *)this,pvVar3);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    std::shared_ptr<celero::Experiment>::shared_ptr
              ((shared_ptr<celero::Experiment> *)this,(nullptr_t)0x0);
    _Var4._M_pi = extraout_RDX_00;
  }
  sVar5.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  sVar5.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<celero::Experiment>)
         sVar5.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Experiment> Benchmark::getExperiment(size_t x)
{
	if(x < this->pimpl->experiments.size())
	{
		return this->pimpl->experiments[x];
	}

	return nullptr;
}